

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

void __thiscall
mkvparser::VideoTrack::VideoTrack
          (VideoTrack *this,Segment *pSegment,longlong element_start,longlong element_size)

{
  (this->super_Track).m_pSegment = pSegment;
  (this->super_Track).m_element_start = element_start;
  (this->super_Track).m_element_size = element_size;
  (this->super_Track).m_info.uid = 0;
  (this->super_Track).m_info.defaultDuration = 0;
  (this->super_Track).m_info.codecDelay = 0;
  (this->super_Track).m_info.seekPreRoll = 0;
  (this->super_Track).m_info.nameAsUTF8 = (char *)0x0;
  (this->super_Track).m_info.language = (char *)0x0;
  (this->super_Track).m_info.codecId = (char *)0x0;
  (this->super_Track).m_info.codecNameAsUTF8 = (char *)0x0;
  (this->super_Track).m_info.codecPrivate = (uchar *)0x0;
  (this->super_Track).m_info.codecPrivateSize = 0;
  (this->super_Track).m_info.lacing = false;
  (this->super_Track).m_eos.super_BlockEntry.m_pCluster = (Cluster *)0x0;
  (this->super_Track).m_eos.super_BlockEntry.m_index = -0x8000000000000000;
  (this->super_Track).m_eos.super_BlockEntry._vptr_BlockEntry =
       (_func_int **)&PTR__BlockEntry_00124bb8;
  (this->super_Track).content_encoding_entries_ = (ContentEncoding **)0x0;
  (this->super_Track).content_encoding_entries_end_ = (ContentEncoding **)0x0;
  (this->super_Track)._vptr_Track = (_func_int **)&PTR__VideoTrack_00124be8;
  this->m_colour_space = (char *)0x0;
  this->m_colour = (Colour *)0x0;
  this->m_projection = (Projection *)0x0;
  return;
}

Assistant:

Track::Track(Segment* pSegment, long long element_start, long long element_size)
    : m_pSegment(pSegment),
      m_element_start(element_start),
      m_element_size(element_size),
      content_encoding_entries_(NULL),
      content_encoding_entries_end_(NULL) {}